

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

bool __thiscall
VW::config::options_boost_po::try_get_positional_option_token
          (options_boost_po *this,string *key,string *token,int position)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
  __first;
  __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
  __last;
  reference pbVar3;
  size_type sVar4;
  string *in_RDX;
  bool bVar5;
  __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
  it;
  parsed_options pos;
  positional_options_description p;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  basic_command_line_parser<char> *in_stack_fffffffffffffe70;
  anon_class_8_1_ba1d59bf_for__M_pred in_stack_fffffffffffffe88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe98;
  basic_command_line_parser<char> *in_stack_fffffffffffffea0;
  __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
  in_stack_fffffffffffffee8;
  positional_options_description local_60 [64];
  string *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  boost::program_options::positional_options_description::positional_options_description(local_60);
  iVar2 = std::__cxx11::string::c_str();
  boost::program_options::positional_options_description::add((char *)local_60,iVar2);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  boost::program_options::basic_command_line_parser<char>::style
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  boost::program_options::basic_command_line_parser<char>::options
            (in_stack_fffffffffffffe70,
             (options_description *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  __first._M_current =
       (basic_option<char> *)
       boost::program_options::basic_command_line_parser<char>::allow_unregistered
                 (in_stack_fffffffffffffe70);
  __last._M_current =
       (basic_option<char> *)
       boost::program_options::basic_command_line_parser<char>::positional
                 (in_stack_fffffffffffffe70,
                  (positional_options_description *)
                  CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_command_line_parser<char> *)in_stack_fffffffffffffee8._M_current);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)0x17ed21);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::begin((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
           *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::end((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
         *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  std::
  find_if<__gnu_cxx::__normal_iterator<boost::program_options::basic_option<char>*,std::vector<boost::program_options::basic_option<char>,std::allocator<boost::program_options::basic_option<char>>>>,VW::config::options_boost_po::try_get_positional_option_token(std::__cxx11::string_const&,std::__cxx11::string&,int)::_lambda(boost::program_options::basic_option<char>&)_1_>
            (__first,__last,in_stack_fffffffffffffe88);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::end((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
         *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
                      *)in_stack_fffffffffffffe70,
                     (__normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  bVar5 = false;
  if (bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
             ::operator*((__normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
                          *)&stack0xfffffffffffffee8);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pbVar3->value);
    bVar5 = sVar4 != 0;
  }
  if (bVar5) {
    __gnu_cxx::
    __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
    ::operator*((__normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
                 *)&stack0xfffffffffffffee8);
    in_stack_fffffffffffffe70 =
         (basic_command_line_parser<char> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe70,
              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    std::__cxx11::string::operator=(local_20,(string *)in_stack_fffffffffffffe70);
  }
  local_1 = bVar5;
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x17eea6);
  boost::program_options::positional_options_description::~positional_options_description
            ((positional_options_description *)in_stack_fffffffffffffe70);
  return (bool)(local_1 & 1);
}

Assistant:

bool try_get_positional_option_token(const std::string& key, std::string& token, int position)
  {
    po::positional_options_description p;
    p.add(key.c_str(), position);
    po::parsed_options pos = po::command_line_parser(m_command_line)
                                 .style(po::command_line_style::default_style ^ po::command_line_style::allow_guessing)
                                 .options(master_description)
                                 .allow_unregistered()
                                 .positional(p)
                                 .run();

    auto it = std::find_if(pos.options.begin(), pos.options.end(),
        [&key](boost::program_options::option& option) { return option.string_key == key; });

    if (it != pos.options.end() && (*it).value.size() > 0)
    {
      token = (*it).value.at(0);
      return true;
    }

    return false;
  }